

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::BlendA64Mask1DTestHBD_ExtremeValues_Test::
~BlendA64Mask1DTestHBD_ExtremeValues_Test(BlendA64Mask1DTestHBD_ExtremeValues_Test *this)

{
  BlendA64Mask1DTestHBD_ExtremeValues_Test *in_stack_00000010;
  
  anon_unknown.dwarf_10310e3::BlendA64Mask1DTestHBD_ExtremeValues_Test::
  ~BlendA64Mask1DTestHBD_ExtremeValues_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, ExtremeValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    const int hi = 1 << bit_depth_;
    const int lo = hi - 2;

    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_(hi - lo) + lo;
      dst_tst_[i] = rng_(hi - lo) + lo;
      src0_[i] = rng_(hi - lo) + lo;
      src1_[i] = rng_(hi - lo) + lo;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      Common(bsize);
    }
  }
}